

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int exported_names_cmp(void *p1,void *p2,void *opaque)

{
  int iVar1;
  JSValue v;
  JSValue v_00;
  int ret;
  JSValue str2;
  JSValue str1;
  ExportedNameEntry *me2;
  ExportedNameEntry *me1;
  JSContext *ctx;
  undefined1 in_stack_ffffffffffffff88 [16];
  JSContext *ctx_00;
  JSValue v_01;
  undefined4 local_54;
  
  v = JS_AtomToString(in_stack_ffffffffffffff88._8_8_,in_stack_ffffffffffffff88._4_4_);
  v_01 = v;
  v_00 = JS_AtomToString(in_stack_ffffffffffffff88._8_8_,in_stack_ffffffffffffff88._4_4_);
  ctx_00 = (JSContext *)v_00.tag;
  iVar1 = JS_IsException(v);
  if (iVar1 == 0) {
    iVar1 = JS_IsException(v_00);
    if (iVar1 == 0) {
      local_54 = js_string_compare((JSContext *)v_01.tag,(JSString *)v_01.u.ptr,(JSString *)ctx_00);
      goto LAB_00156497;
    }
  }
  local_54 = 0;
LAB_00156497:
  JS_FreeValue(ctx_00,v_01);
  JS_FreeValue(ctx_00,v_01);
  return local_54;
}

Assistant:

static int exported_names_cmp(const void *p1, const void *p2, void *opaque)
{
    JSContext *ctx = opaque;
    const ExportedNameEntry *me1 = p1;
    const ExportedNameEntry *me2 = p2;
    JSValue str1, str2;
    int ret;

    /* XXX: should avoid allocation memory in atom comparison */
    str1 = JS_AtomToString(ctx, me1->export_name);
    str2 = JS_AtomToString(ctx, me2->export_name);
    if (JS_IsException(str1) || JS_IsException(str2)) {
        /* XXX: raise an error ? */
        ret = 0;
    } else {
        ret = js_string_compare(ctx, JS_VALUE_GET_STRING(str1),
                                JS_VALUE_GET_STRING(str2));
    }
    JS_FreeValue(ctx, str1);
    JS_FreeValue(ctx, str2);
    return ret;
}